

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defopcode.c
# Opt level: O3

int synthetic_opcode_size(OpcodeMappingInfo *map)

{
  int iVar1;
  int i;
  long lVar2;
  
  iVar1 = 4;
  lVar2 = 0;
  do {
    if (((ushort)map->bitfield[lVar2] & 0x1ffe) == 0x1efc) {
      return iVar1;
    }
    iVar1 = iVar1 + (uint)((ushort)map->bitfield[lVar2] >> 0xf) + 1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  return iVar1;
}

Assistant:

int
synthetic_opcode_size (const OpcodeMappingInfo *map)
{
  int i, size = PTR_WORDS;  /* Account for the synthetic opcode. */

  for (i = 0; i < MAX_BITFIELDS; i++)
    {
      if (IS_TERMINATING_BITFIELD (&map->bitfield[i]))
	break;
      size += map->bitfield[i].words + 1;
    }

  return size;
}